

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::ColumnMetaData::ColumnMetaData(ColumnMetaData *this)

{
  Statistics *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__ColumnMetaData_00c01f78;
  *(undefined ***)in_RDI = &PTR__ColumnMetaData_00c01f78;
  *(undefined4 *)&in_RDI->max = 0;
  duckdb::vector<duckdb_parquet::Encoding::type,_true>::vector
            ((vector<duckdb_parquet::Encoding::type,_true> *)0x70ccfe);
  duckdb::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x70cd0c);
  *(undefined4 *)&in_RDI->field_0x40 = 0;
  in_RDI->null_count = 0;
  in_RDI->distinct_count = 0;
  *(undefined8 *)&in_RDI->max_value = 0;
  duckdb::vector<duckdb_parquet::KeyValue,_true>::vector
            ((vector<duckdb_parquet::KeyValue,_true> *)0x70cd39);
  *(undefined8 *)&in_RDI->min_value = 0;
  *(undefined8 *)&in_RDI->field_0x80 = 0;
  *(undefined8 *)&in_RDI->field_0x88 = 0;
  Statistics::Statistics(in_RDI);
  duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::vector
            ((vector<duckdb_parquet::PageEncodingStats,_true> *)0x70cd79);
  *(undefined8 *)&in_RDI[2].max = 0;
  *(undefined4 *)&in_RDI[2].field_0x10 = 0;
  SizeStatistics::SizeStatistics((SizeStatistics *)in_RDI);
  _ColumnMetaData__isset::_ColumnMetaData__isset((_ColumnMetaData__isset *)&in_RDI[2].field_0x60);
  return;
}

Assistant:

ColumnMetaData::ColumnMetaData() noexcept
   : type(static_cast<Type::type>(0)),
     codec(static_cast<CompressionCodec::type>(0)),
     num_values(0),
     total_uncompressed_size(0),
     total_compressed_size(0),
     data_page_offset(0),
     index_page_offset(0),
     dictionary_page_offset(0),
     bloom_filter_offset(0),
     bloom_filter_length(0) {
}